

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O1

void __thiscall proto2_unittest::TestAllTypesLite::clear_oneof_field(TestAllTypesLite *this)

{
  long *plVar1;
  ulong uVar2;
  
  switch((this->field_0)._impl_._oneof_case_[0]) {
  case 0x70:
  case 0x73:
  case 0x75:
    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar2 & 1) != 0) {
      uVar2 = *(ulong *)(uVar2 & 0xfffffffffffffffe);
    }
    plVar1 = *(long **)((long)&this->field_0 + 0x328);
    if (uVar2 == 0) {
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 8))();
      }
    }
    else if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 0x10))();
    }
    break;
  case 0x71:
  case 0x72:
    google::protobuf::internal::ArenaStringPtr::Destroy
              (&(this->field_0)._impl_.oneof_field_.oneof_string_);
  }
  (this->field_0)._impl_._oneof_case_[0] = 0;
  return;
}

Assistant:

void TestAllTypesLite::clear_oneof_field() {
// @@protoc_insertion_point(one_of_clear_start:proto2_unittest.TestAllTypesLite)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  switch (oneof_field_case()) {
    case kOneofUint32: {
      // No need to clear
      break;
    }
    case kOneofNestedMessage: {
      if (GetArena() == nullptr) {
        delete _impl_.oneof_field_.oneof_nested_message_;
      } else if (::google::protobuf::internal::DebugHardenClearOneofMessageOnArena()) {
        if (_impl_.oneof_field_.oneof_nested_message_ != nullptr) {
          _impl_.oneof_field_.oneof_nested_message_->Clear();
        }
      }
      break;
    }
    case kOneofString: {
      _impl_.oneof_field_.oneof_string_.Destroy();
      break;
    }
    case kOneofBytes: {
      _impl_.oneof_field_.oneof_bytes_.Destroy();
      break;
    }
    case kOneofLazyNestedMessage: {
      if (GetArena() == nullptr) {
        delete _impl_.oneof_field_.oneof_lazy_nested_message_;
      } else if (::google::protobuf::internal::DebugHardenClearOneofMessageOnArena()) {
        if (_impl_.oneof_field_.oneof_lazy_nested_message_ != nullptr) {
          _impl_.oneof_field_.oneof_lazy_nested_message_->Clear();
        }
      }
      break;
    }
    case kOneofNestedMessage2: {
      if (GetArena() == nullptr) {
        delete _impl_.oneof_field_.oneof_nested_message2_;
      } else if (::google::protobuf::internal::DebugHardenClearOneofMessageOnArena()) {
        if (_impl_.oneof_field_.oneof_nested_message2_ != nullptr) {
          _impl_.oneof_field_.oneof_nested_message2_->Clear();
        }
      }
      break;
    }
    case ONEOF_FIELD_NOT_SET: {
      break;
    }
  }
  _impl_._oneof_case_[0] = ONEOF_FIELD_NOT_SET;
}